

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterSort(SortSubtask *pTask,SorterList *pList)

{
  SorterCompare p_Var1;
  void *p_00;
  SorterRecord *local_50;
  SorterRecord *local_48;
  SorterRecord *pNext;
  SorterRecord *pSStack_38;
  int rc;
  SorterRecord *p;
  SorterRecord **aSlot;
  int i;
  SorterList *pList_local;
  SortSubtask *pTask_local;
  
  pTask_local._4_4_ = vdbeSortAllocUnpacked(pTask);
  if (pTask_local._4_4_ == 0) {
    pSStack_38 = pList->pList;
    p_Var1 = vdbeSorterGetCompare(pTask->pSorter);
    pTask->xCompare = p_Var1;
    p_00 = sqlite3MallocZero(0x200);
    if (p_00 == (void *)0x0) {
      pTask_local._4_4_ = 7;
    }
    else {
      while (pSStack_38 != (SorterRecord *)0x0) {
        if (pList->aMemory == (u8 *)0x0) {
          local_48 = (pSStack_38->u).pNext;
        }
        else if (pSStack_38 == (SorterRecord *)pList->aMemory) {
          local_48 = (SorterRecord *)0x0;
        }
        else {
          local_48 = (SorterRecord *)(pList->aMemory + (pSStack_38->u).iNext);
        }
        (pSStack_38->u).pNext = (SorterRecord *)0x0;
        aSlot._4_4_ = 0;
        while (*(long *)((long)p_00 + (long)aSlot._4_4_ * 8) != 0) {
          pSStack_38 = vdbeSorterMerge(pTask,pSStack_38,
                                       *(SorterRecord **)((long)p_00 + (long)aSlot._4_4_ * 8));
          *(undefined8 *)((long)p_00 + (long)aSlot._4_4_ * 8) = 0;
          aSlot._4_4_ = aSlot._4_4_ + 1;
        }
        *(SorterRecord **)((long)p_00 + (long)aSlot._4_4_ * 8) = pSStack_38;
        pSStack_38 = local_48;
      }
      pSStack_38 = (SorterRecord *)0x0;
      for (aSlot._4_4_ = 0; aSlot._4_4_ < 0x40; aSlot._4_4_ = aSlot._4_4_ + 1) {
        if (*(long *)((long)p_00 + (long)aSlot._4_4_ * 8) != 0) {
          if (pSStack_38 == (SorterRecord *)0x0) {
            local_50 = *(SorterRecord **)((long)p_00 + (long)aSlot._4_4_ * 8);
          }
          else {
            local_50 = vdbeSorterMerge(pTask,pSStack_38,
                                       *(SorterRecord **)((long)p_00 + (long)aSlot._4_4_ * 8));
          }
          pSStack_38 = local_50;
        }
      }
      pList->pList = pSStack_38;
      sqlite3_free(p_00);
      pTask_local._4_4_ = (uint)pTask->pUnpacked->errCode;
    }
  }
  return pTask_local._4_4_;
}

Assistant:

static int vdbeSorterSort(SortSubtask *pTask, SorterList *pList){
  int i;
  SorterRecord **aSlot;
  SorterRecord *p;
  int rc;

  rc = vdbeSortAllocUnpacked(pTask);
  if( rc!=SQLITE_OK ) return rc;

  p = pList->pList;
  pTask->xCompare = vdbeSorterGetCompare(pTask->pSorter);

  aSlot = (SorterRecord **)sqlite3MallocZero(64 * sizeof(SorterRecord *));
  if( !aSlot ){
    return SQLITE_NOMEM_BKPT;
  }

  while( p ){
    SorterRecord *pNext;
    if( pList->aMemory ){
      if( (u8*)p==pList->aMemory ){
        pNext = 0;
      }else{
        assert( p->u.iNext<sqlite3MallocSize(pList->aMemory) );
        pNext = (SorterRecord*)&pList->aMemory[p->u.iNext];
      }
    }else{
      pNext = p->u.pNext;
    }

    p->u.pNext = 0;
    for(i=0; aSlot[i]; i++){
      p = vdbeSorterMerge(pTask, p, aSlot[i]);
      aSlot[i] = 0;
    }
    aSlot[i] = p;
    p = pNext;
  }

  p = 0;
  for(i=0; i<64; i++){
    if( aSlot[i]==0 ) continue;
    p = p ? vdbeSorterMerge(pTask, p, aSlot[i]) : aSlot[i];
  }
  pList->pList = p;

  sqlite3_free(aSlot);
  assert( pTask->pUnpacked->errCode==SQLITE_OK 
       || pTask->pUnpacked->errCode==SQLITE_NOMEM 
  );
  return pTask->pUnpacked->errCode;
}